

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall IVmBifTadsRNG::get_state(IVmBifTadsRNG *this,vm_val_t *val)

{
  int32_t intval;
  vm_obj_id_t obj;
  undefined8 *puVar1;
  long *plVar2;
  vm_val_t *in_RSI;
  long *in_RDI;
  err_frame_t err_cur__;
  char *buf;
  size_t len;
  size_t in_stack_fffffffffffffed0;
  void *pvVar3;
  char *in_stack_fffffffffffffed8;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffffee0;
  int in_root_set;
  uint local_100 [2];
  undefined8 local_f8;
  void *local_f0;
  __jmp_buf_tag _Stack_e8;
  void *local_20;
  ulong local_18;
  vm_val_t *local_10;
  
  in_root_set = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_10 = in_RSI;
  local_18 = (**(code **)(*in_RDI + 0x30))();
  if (local_18 == 0) {
    intval = (**(code **)(*in_RDI + 0x38))();
    vm_val_t::set_int(local_10,intval);
  }
  else {
    local_20 = operator_new__(local_18);
    puVar1 = (undefined8 *)_ZTW11G_err_frame();
    local_f8 = *puVar1;
    plVar2 = (long *)_ZTW11G_err_frame();
    *plVar2 = (long)local_100;
    local_100[0] = _setjmp(&_Stack_e8);
    if (local_100[0] == 0) {
      (**(code **)(*in_RDI + 0x48))(in_RDI,local_20);
      obj = CVmObjByteArray::create_from_bytes
                      (in_root_set,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      vm_val_t::set_obj(local_10,obj);
    }
    if (((local_100[0] & 0x8000) == 0) &&
       (local_100[0] = local_100[0] | 0x8000, local_20 != (void *)0x0)) {
      operator_delete__(local_20);
    }
    uVar4 = local_f8;
    puVar1 = (undefined8 *)_ZTW11G_err_frame();
    *puVar1 = uVar4;
    if ((local_100[0] & 0x4001) != 0) {
      puVar1 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar1 & 2) != 0) {
        plVar2 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar2 + 0x10));
      }
      pvVar3 = local_f0;
      plVar2 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar2 + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_100[0] & 2) != 0) {
      free(local_f0);
    }
  }
  return;
}

Assistant:

void get_state(VMG_ vm_val_t *val)
    {
        size_t len = get_state_size();
        if (len == 0)
        {
            /* simple int32_t state */
            val->set_int(get_state_int());
        }
        else
        {
            /* allocate a buffer */
            char *buf = new char[len];

            /* make sure we delete the allocated buffer */
            err_try
            {
                /* get the state into our buffer */
                get_state_buf(buf);

                /* create a ByteArray from the state vector */
                val->set_obj(CVmObjByteArray::create_from_bytes(
                    vmg_ FALSE, buf, len));
            }
            err_finally
            {
                /* done with the buffer */
                delete [] buf;
            }